

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_draw_list_alloc_vertices(nk_draw_list *list,nk_size count)

{
  void *vtx;
  nk_size count_local;
  nk_draw_list *list_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x247f,"void *nk_draw_list_alloc_vertices(struct nk_draw_list *, nk_size)");
  }
  if (list == (nk_draw_list *)0x0) {
    list_local = (nk_draw_list *)0x0;
  }
  else {
    list_local = (nk_draw_list *)
                 nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,(list->config).vertex_size * count,
                                 (list->config).vertex_alignment);
    if (list_local == (nk_draw_list *)0x0) {
      list_local = (nk_draw_list *)0x0;
    }
    else {
      list->vertex_count = (int)count + list->vertex_count;
      if (0xfffe < list->vertex_count) {
        __assert_fail("(sizeof(nk_draw_index) == 2 && list->vertex_count < 65535 && \"To many verticies for 16-bit vertex indicies. Please read comment above on how to solve this problem\")"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                      ,0x2490,"void *nk_draw_list_alloc_vertices(struct nk_draw_list *, nk_size)");
      }
    }
  }
  return list_local;
}

Assistant:

NK_INTERN void*
nk_draw_list_alloc_vertices(struct nk_draw_list *list, nk_size count)
{
    void *vtx;
    NK_ASSERT(list);
    if (!list) return 0;
    vtx = nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT,
        list->config.vertex_size*count, list->config.vertex_alignment);
    if (!vtx) return 0;
    list->vertex_count += (unsigned int)count;

    /* This assert triggers because your are drawing a lot of stuff and nuklear
     * defined `nk_draw_index` as `nk_ushort` to safe space be default.
     *
     * So you reached the maximum number of indicies or rather vertexes.
     * To solve this issue please change typdef `nk_draw_index` to `nk_uint`
     * and don't forget to specify the new element size in your drawing
     * backend (OpenGL, DirectX, ...). For example in OpenGL for `glDrawElements`
     * instead of specifing `GL_UNSIGNED_SHORT` you have to define `GL_UNSIGNED_INT`.
     * Sorry for the inconvenience. */
    NK_ASSERT((sizeof(nk_draw_index) == 2 && list->vertex_count < NK_USHORT_MAX &&
        "To many verticies for 16-bit vertex indicies. Please read comment above on how to solve this problem"));
    return vtx;
}